

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void updateAccumulator(Parse *pParse,int regAcc,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pList;
  int *piVar1;
  int target;
  CollSeq *zP4;
  int iVar2;
  AggInfo_func *pAVar3;
  Expr **ppEVar4;
  int iVar5;
  int nReg;
  int iVar6;
  ExprList_item *pEVar7;
  uint local_44;
  
  p = pParse->pVdbe;
  pAggInfo->directMode = '\x01';
  pAVar3 = pAggInfo->aFunc;
  iVar6 = 0;
  for (iVar2 = 0; iVar2 < pAggInfo->nFunc; iVar2 = iVar2 + 1) {
    pList = (pAVar3->pExpr->x).pList;
    local_44 = 0;
    nReg = 0;
    target = 0;
    if (pList != (ExprList *)0x0) {
      nReg = pList->nExpr;
      target = sqlite3GetTempRange(pParse,nReg);
      sqlite3ExprCodeExprList(pParse,pList,target,0,'\x01');
    }
    if (-1 < pAVar3->iDistinct) {
      local_44 = sqlite3VdbeMakeLabel(p);
      codeDistinct(pParse,pAVar3->iDistinct,local_44,1,target);
    }
    if ((pAVar3->pFunc->funcFlags & 0x20) != 0) {
      pEVar7 = pList->a;
      zP4 = (CollSeq *)0x0;
      for (iVar5 = 0; (zP4 == (CollSeq *)0x0 && (iVar5 < nReg)); iVar5 = iVar5 + 1) {
        zP4 = sqlite3ExprCollSeq(pParse,pEVar7->pExpr);
        pEVar7 = pEVar7 + 1;
      }
      if (zP4 == (CollSeq *)0x0) {
        zP4 = pParse->db->pDfltColl;
      }
      if (iVar6 == 0) {
        if (pAggInfo->nAccumulator == 0) {
          iVar6 = 0;
        }
        else {
          iVar6 = pParse->nMem + 1;
          pParse->nMem = iVar6;
        }
      }
      sqlite3VdbeAddOp4(p,0x52,iVar6,0,0,(char *)zP4,-2);
    }
    sqlite3VdbeAddOp3(p,0x9b,0,target,pAVar3->iMem);
    sqlite3VdbeAppendP4(p,pAVar3->pFunc,-8);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = (ushort)nReg & 0xff;
    }
    sqlite3ReleaseTempRange(pParse,target,nReg);
    if ((local_44 != 0) && (piVar1 = p->pParse->aLabel, piVar1 != (int *)0x0)) {
      piVar1[(int)~local_44] = p->nOp;
    }
    pAVar3 = pAVar3 + 1;
  }
  if (iVar6 == 0) {
    iVar2 = 0;
    if ((regAcc == 0) || (iVar6 = regAcc, iVar2 = 0, pAggInfo->nAccumulator == 0))
    goto LAB_0016dd7f;
  }
  iVar2 = sqlite3VdbeAddOp1(p,0x12,iVar6);
LAB_0016dd7f:
  ppEVar4 = &pAggInfo->aCol->pExpr;
  for (iVar6 = 0; iVar6 < pAggInfo->nAccumulator; iVar6 = iVar6 + 1) {
    sqlite3ExprCode(pParse,*ppEVar4,*(int *)((long)ppEVar4 + -4));
    ppEVar4 = ppEVar4 + 4;
  }
  pAggInfo->directMode = '\0';
  if (iVar2 == 0) {
    return;
  }
  sqlite3VdbeJumpHere(p,iVar2);
  return;
}

Assistant:

static void updateAccumulator(Parse *pParse, int regAcc, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  int regHit = 0;
  int addrHitTest = 0;
  struct AggInfo_func *pF;
  struct AggInfo_col *pC;

  pAggInfo->directMode = 1;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    int nArg;
    int addrNext = 0;
    int regAgg;
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    if( pList ){
      nArg = pList->nExpr;
      regAgg = sqlite3GetTempRange(pParse, nArg);
      sqlite3ExprCodeExprList(pParse, pList, regAgg, 0, SQLITE_ECEL_DUP);
    }else{
      nArg = 0;
      regAgg = 0;
    }
    if( pF->iDistinct>=0 ){
      addrNext = sqlite3VdbeMakeLabel(v);
      testcase( nArg==0 );  /* Error condition */
      testcase( nArg>1 );   /* Also an error */
      codeDistinct(pParse, pF->iDistinct, addrNext, 1, regAgg);
    }
    if( pF->pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
      CollSeq *pColl = 0;
      struct ExprList_item *pItem;
      int j;
      assert( pList!=0 );  /* pList!=0 if pF->pFunc has NEEDCOLL */
      for(j=0, pItem=pList->a; !pColl && j<nArg; j++, pItem++){
        pColl = sqlite3ExprCollSeq(pParse, pItem->pExpr);
      }
      if( !pColl ){
        pColl = pParse->db->pDfltColl;
      }
      if( regHit==0 && pAggInfo->nAccumulator ) regHit = ++pParse->nMem;
      sqlite3VdbeAddOp4(v, OP_CollSeq, regHit, 0, 0, (char *)pColl, P4_COLLSEQ);
    }
    sqlite3VdbeAddOp3(v, OP_AggStep, 0, regAgg, pF->iMem);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
    sqlite3VdbeChangeP5(v, (u8)nArg);
    sqlite3ReleaseTempRange(pParse, regAgg, nArg);
    if( addrNext ){
      sqlite3VdbeResolveLabel(v, addrNext);
    }
  }
  if( regHit==0 && pAggInfo->nAccumulator ){
    regHit = regAcc;
  }
  if( regHit ){
    addrHitTest = sqlite3VdbeAddOp1(v, OP_If, regHit); VdbeCoverage(v);
  }
  for(i=0, pC=pAggInfo->aCol; i<pAggInfo->nAccumulator; i++, pC++){
    sqlite3ExprCode(pParse, pC->pExpr, pC->iMem);
  }
  pAggInfo->directMode = 0;
  if( addrHitTest ){
    sqlite3VdbeJumpHere(v, addrHitTest);
  }
}